

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatfile.cpp
# Opt level: O2

FILE * __thiscall FlatFileSeq::Open(FlatFileSeq *this,FlatFilePos *pos,bool read_only)

{
  string_view source_file;
  string_view source_file_00;
  bool bVar1;
  int iVar2;
  FILE *__stream;
  Logger *pLVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  char *__modes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view str;
  string_view str_00;
  string local_110;
  string log_msg;
  path path;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (pos->nFile == -1) {
    __stream = (FILE *)0x0;
    goto LAB_003bd662;
  }
  FileName(&path,this,pos);
  std::filesystem::__cxx11::path::parent_path();
  bVar1 = std::filesystem::is_symlink((path *)&log_msg);
  if (bVar1) {
    bVar1 = std::filesystem::is_directory((path *)&log_msg);
    if (!bVar1) goto LAB_003bd40c;
  }
  else {
LAB_003bd40c:
    std::filesystem::create_directories((path *)&log_msg);
  }
  std::filesystem::__cxx11::path::~path((path *)&log_msg);
  __modes = "rb+";
  if (read_only) {
    __modes = "rb";
  }
  __stream = fsbridge::fopen((char *)&path,__modes);
  if (__stream == (FILE *)0x0 && !read_only) {
    __stream = fsbridge::fopen((char *)&path,"wb+");
  }
  if (__stream == (FILE *)0x0) {
    std::filesystem::__cxx11::path::string(&local_110,&path.super_path);
    pLVar3 = LogInstance();
    bVar1 = BCLog::Logger::Enabled(pLVar3);
    if (bVar1) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length = 0;
      log_msg.field_2._M_local_buf[0] = '\0';
      tinyformat::format<std::__cxx11::string>
                (&local_40,(tinyformat *)"Unable to open file %s\n",(char *)&local_110,in_RCX);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      pLVar3 = LogInstance();
      local_40._M_dataplus._M_p = (pointer)0x55;
      local_40._M_string_length = 0x6e0e9a;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/flatfile.cpp";
      source_file_00._M_len = 0x55;
      logging_function_00._M_str = "Open";
      logging_function_00._M_len = 4;
      str_00._M_str = log_msg._M_dataplus._M_p;
      str_00._M_len = log_msg._M_string_length;
      BCLog::Logger::LogPrintStr(pLVar3,str_00,logging_function_00,source_file_00,0x2c,ALL,Info);
      std::__cxx11::string::~string((string *)&log_msg);
    }
    std::__cxx11::string::~string((string *)&local_110);
LAB_003bd656:
    __stream = (FILE *)0x0;
  }
  else if ((ulong)pos->nPos != 0) {
    iVar2 = fseek(__stream,(ulong)pos->nPos,0);
    if (iVar2 != 0) {
      std::filesystem::__cxx11::path::string(&local_110,&path.super_path);
      pLVar3 = LogInstance();
      bVar1 = BCLog::Logger::Enabled(pLVar3);
      if (bVar1) {
        log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
        log_msg._M_string_length = 0;
        log_msg.field_2._M_local_buf[0] = '\0';
        tinyformat::format<unsigned_int,std::__cxx11::string>
                  (&local_40,(tinyformat *)"Unable to seek to position %u of %s\n",
                   (char *)&pos->nPos,(uint *)&local_110,in_R8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&log_msg,&local_40);
        std::__cxx11::string::~string((string *)&local_40);
        pLVar3 = LogInstance();
        local_40._M_dataplus._M_p = (pointer)0x55;
        local_40._M_string_length = 0x6e0e9a;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/flatfile.cpp"
        ;
        source_file._M_len = 0x55;
        logging_function._M_str = "Open";
        logging_function._M_len = 4;
        str._M_str = log_msg._M_dataplus._M_p;
        str._M_len = log_msg._M_string_length;
        BCLog::Logger::LogPrintStr(pLVar3,str,logging_function,source_file,0x30,ALL,Info);
        std::__cxx11::string::~string((string *)&log_msg);
      }
      std::__cxx11::string::~string((string *)&local_110);
      fclose(__stream);
      goto LAB_003bd656;
    }
  }
  std::filesystem::__cxx11::path::~path(&path.super_path);
LAB_003bd662:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (FILE *)__stream;
  }
  __stack_chk_fail();
}

Assistant:

FILE* FlatFileSeq::Open(const FlatFilePos& pos, bool read_only) const
{
    if (pos.IsNull()) {
        return nullptr;
    }
    fs::path path = FileName(pos);
    fs::create_directories(path.parent_path());
    FILE* file = fsbridge::fopen(path, read_only ? "rb": "rb+");
    if (!file && !read_only)
        file = fsbridge::fopen(path, "wb+");
    if (!file) {
        LogPrintf("Unable to open file %s\n", fs::PathToString(path));
        return nullptr;
    }
    if (pos.nPos && fseek(file, pos.nPos, SEEK_SET)) {
        LogPrintf("Unable to seek to position %u of %s\n", pos.nPos, fs::PathToString(path));
        fclose(file);
        return nullptr;
    }
    return file;
}